

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

parameter * __thiscall
clipp::detail::action_provider<clipp::parameter>::set<int>
          (action_provider<clipp::parameter> *this,int *t)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::_Function_handler<void_(const_char_*),_clipp::detail::map_arg_to<int>_>::_M_invoke
  ;
  local_18 = std::_Function_handler<void_(const_char_*),_clipp::detail::map_arg_to<int>_>::
             _M_manager;
  local_28._M_unused._M_object = t;
  std::vector<std::function<void(char_const*)>,std::allocator<std::function<void(char_const*)>>>::
  emplace_back<std::function<void(char_const*)>>
            ((vector<std::function<void(char_const*)>,std::allocator<std::function<void(char_const*)>>>
              *)this,(function<void_(const_char_*)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return (parameter *)
         &this[-1].blockedActions_.
          super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

Derived&
    set(Target& t) {
        static_assert(!std::is_pointer<Target>::value,
                      "parameter target type must not be a pointer");

        return call(clipp::set(t));
    }